

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

vec3f __thiscall Triangle::Ns(Triangle *this,point *p)

{
  vec3f *in_RDI;
  vec3f vVar1;
  vec3f *in_stack_fffffffffffffe00;
  
  ::operator-(in_stack_fffffffffffffe00,in_RDI);
  ::operator-(in_stack_fffffffffffffe00,in_RDI);
  ::operator-(in_stack_fffffffffffffe00,in_RDI);
  cross(in_stack_fffffffffffffe00,in_RDI);
  norm((vec3f *)0x184d78);
  ::operator*(in_stack_fffffffffffffe00,(float)((ulong)in_RDI >> 0x20));
  ::operator*(in_stack_fffffffffffffe00,(float)((ulong)in_RDI >> 0x20));
  ::operator+(in_stack_fffffffffffffe00,in_RDI);
  ::operator-(in_stack_fffffffffffffe00,in_RDI);
  ::operator-(in_stack_fffffffffffffe00,in_RDI);
  ::operator-(in_stack_fffffffffffffe00,in_RDI);
  cross(in_stack_fffffffffffffe00,in_RDI);
  norm((vec3f *)0x184f47);
  ::operator*(in_stack_fffffffffffffe00,(float)((ulong)in_RDI >> 0x20));
  ::operator*(in_stack_fffffffffffffe00,(float)((ulong)in_RDI >> 0x20));
  ::operator+(in_stack_fffffffffffffe00,in_RDI);
  vVar1 = normalized(in_stack_fffffffffffffe00);
  return vVar1;
}

Assistant:

vec3f Ns(const point& p) const
	{
		assert(onsurface(p));
		return normalized(
			vn1 + (vn3-vn1) * norm(cross(p-v1, v2-v1)) * one_by_2S
				+ (vn2-vn1) * norm(cross(p-v1, v3-v1)) * one_by_2S); // TO OPTIMIZE
	}